

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro.c
# Opt level: O1

int coro_stack_alloc(coro_stack *stack,uint size)

{
  size_t __len;
  ulong uVar1;
  void *__addr;
  ulong uVar2;
  size_t sVar3;
  
  uVar2 = 0x40000;
  if (size != 0) {
    uVar2 = (ulong)size;
  }
  stack->sptr = (void *)0x0;
  if (coro_pagesize_pagesize == 0) {
    coro_pagesize_pagesize = sysconf(0x1e);
  }
  uVar2 = (uVar2 * 8 + coro_pagesize_pagesize) - 1;
  if (coro_pagesize_pagesize == 0) {
    coro_pagesize_pagesize = sysconf(0x1e);
  }
  uVar1 = coro_pagesize_pagesize;
  sVar3 = uVar2 - uVar2 % coro_pagesize_pagesize;
  stack->ssze = sVar3;
  __len = sVar3 + uVar1 * 4;
  __addr = mmap((void *)0x0,__len,7,0x22,-1,0);
  if ((__addr == (void *)0xffffffffffffffff) &&
     (__addr = mmap((void *)0x0,__len,3,0x22,-1,0), __addr == (void *)0xffffffffffffffff)) {
    return 0;
  }
  if (coro_pagesize_pagesize == 0) {
    coro_pagesize_pagesize = sysconf(0x1e);
  }
  mprotect(__addr,coro_pagesize_pagesize << 2,0);
  if (coro_pagesize_pagesize == 0) {
    coro_pagesize_pagesize = sysconf(0x1e);
  }
  stack->sptr = (void *)((long)__addr + coro_pagesize_pagesize * 4);
  return 1;
}

Assistant:

int
coro_stack_alloc (struct coro_stack *stack, unsigned int size)
{
  if (!size)
    size = 256 * 1024;

  stack->sptr = 0;
  stack->ssze = ((size_t)size * sizeof (void *) + PAGESIZE - 1) / PAGESIZE * PAGESIZE;

#if CORO_FIBER

  stack->sptr = (void *)stack;
  return 1;

#else

  size_t ssze = stack->ssze + CORO_GUARDPAGES * PAGESIZE;
  void *base;

  #if CORO_MMAP
    /* mmap supposedly does allocate-on-write for us */
    base = mmap (0, ssze, PROT_READ | PROT_WRITE | PROT_EXEC, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);

    if (base == (void *)-1)
      {
        /* some systems don't let us have executable heap */
        /* we assume they won't need executable stack in that case */
        base = mmap (0, ssze, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);

        if (base == (void *)-1)
          return 0;
      }

    #if CORO_GUARDPAGES
      mprotect (base, CORO_GUARDPAGES * PAGESIZE, PROT_NONE);
    #endif

    base = (void*)((char *)base + CORO_GUARDPAGES * PAGESIZE);
  #else
    base = malloc (ssze);
    if (!base)
      return 0;
  #endif

  #if CORO_USE_VALGRIND
    stack->valgrind_id = VALGRIND_STACK_REGISTER ((char *)base, ((char *)base) + ssze - CORO_GUARDPAGES * PAGESIZE);
  #endif

  stack->sptr = base;
  return 1;

#endif
}